

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

int __thiscall asl::InetAddress::port(InetAddress *this)

{
  ushort uVar1;
  uint uVar2;
  
  uVar2 = 0;
  if (this->_type - IPv4 < 2) {
    uVar1 = *(ushort *)((this->_data)._a + 2);
    uVar2 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
  }
  return uVar2;
}

Assistant:

int InetAddress::port() const
{
	if (_type == IPv6)
	{
		sockaddr_in6* addr = (sockaddr_in6*)ptr();
		return ntohs(addr->sin6_port);
	}
	else if (_type == IPv4)
	{
		sockaddr_in* addr = (sockaddr_in*)ptr();
		return ntohs(addr->sin_port);
	}
	return 0;
}